

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void push_object(loc_conflict grid)

{
  queue *pqVar1;
  _Bool _Var2;
  wchar_t wVar3;
  queue *q;
  trap *ptVar4;
  object *dest;
  loc_conflict lVar5;
  object *poVar6;
  size_t sVar7;
  _Bool local_65;
  loc_conflict lStack_64;
  _Bool dummy;
  loc_conflict newgrid;
  wchar_t d;
  monster *mimic;
  object *newobj;
  object *next;
  trap *trap;
  queue *queue;
  object *obj;
  feature *feat_old;
  loc_conflict grid_local;
  
  feat_old = (feature *)grid;
  obj = (object *)square_feat((chunk *)cave,grid);
  queue = (queue *)square_object((chunk *)cave,(loc_conflict)feat_old);
  q = q_new((ulong)z_info->floor_size);
  ptVar4 = square_trap((chunk *)cave,(loc_conflict)feat_old);
  while (queue != (queue *)0x0) {
    pqVar1 = (queue *)queue[1].data;
    dest = object_new();
    object_copy(dest,(object *)queue);
    dest->oidx = 0;
    lVar5 = (loc_conflict)loc(0,0);
    dest->grid = lVar5;
    if (dest->known != (object *)0x0) {
      poVar6 = object_new();
      dest->known = poVar6;
      object_copy(dest->known,(object *)queue[1].size);
      dest->known->oidx = 0;
      poVar6 = dest->known;
      lVar5 = (loc_conflict)loc(0,0);
      poVar6->grid = lVar5;
    }
    q_push(q,(uintptr_t)dest);
    delist_object(cave,(object *)queue);
    object_delete((chunk *)cave,(chunk *)player->cave,(object **)&queue);
    queue = pqVar1;
  }
  square_set_obj((chunk *)cave,(loc_conflict)feat_old,(object *)0x0);
  square_force_floor((chunk *)cave,(loc_conflict)feat_old);
  square_add_door((chunk *)cave,(loc_conflict)feat_old,false);
LAB_001eaf21:
  do {
    while( true ) {
      sVar7 = q_len(q);
      if (sVar7 == 0) {
        square_set_feat((chunk *)cave,(loc_conflict)feat_old,*(wchar_t *)&obj->artifact);
        if ((ptVar4 != (trap *)0x0) &&
           (_Var2 = square_istrappable((chunk *)cave,(loc_conflict)feat_old), !_Var2)) {
          square_destroy_trap((chunk *)cave,(loc_conflict)feat_old);
        }
        q_free(q);
        return;
      }
      queue = (queue *)q_pop(q);
      if (*(short *)((long)&queue[9].size + 6) != 0) break;
      drop_near((chunk *)cave,(object **)&queue,L'\0',(loc_conflict)feat_old,false,false);
    }
    register0x00000000 = cave_monster(cave,(int)*(short *)((long)&queue[9].size + 6));
    if (register0x00000000 == (monster_conflict *)0x0) {
      __assert_fail("mimic",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-pile.c"
                    ,0x4c2,"void push_object(struct loc)");
    }
    register0x00000000->mimicked_obj = (object *)0x0;
    for (newgrid.x = L'\x01'; local_65 = true, newgrid.x < L'\x04'; newgrid.x = newgrid.x + L'\x01')
    {
      wVar3 = scatter_ext(cave,(loc *)&stack0xffffffffffffff9c,L'\x01',(loc)feat_old,newgrid.x,true,
                          square_isempty);
      if ((L'\0' < wVar3) &&
         (_Var2 = floor_carry((chunk *)cave,lStack_64,(object *)queue,&local_65), _Var2)) {
        monster_swap((loc_conflict)feat_old,lStack_64);
        stack0xffffffffffffffa8->mimicked_obj = (object *)queue;
        goto LAB_001eaf21;
      }
    }
    delete_monster_idx((chunk *)cave,(int)*(short *)((long)&queue[9].size + 6));
    if (queue[1].size != 0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,(object **)&queue[1].size);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,(object **)&queue);
  } while( true );
}

Assistant:

void push_object(struct loc grid)
{
	/* Save the original terrain feature */
	struct feature *feat_old = square_feat(cave, grid);
	struct object *obj = square_object(cave, grid);
	struct queue *queue = q_new(z_info->floor_size);
	struct trap *trap = square_trap(cave, grid);

	/* Push all objects on the square, stripped of pile info, into the queue */
	while (obj) {
		struct object *next = obj->next;
		/* In case the object is known, make a copy to work with
		 * and try to delete the original which will orphan it to
		 * serve as a placeholder for the known version. */
		struct object *newobj = object_new();

		object_copy(newobj, obj);
		newobj->oidx = 0;
		newobj->grid = loc(0, 0);
		if (newobj->known) {
			newobj->known = object_new();
			object_copy(newobj->known, obj->known);
			newobj->known->oidx = 0;
			newobj->known->grid = loc(0, 0);
		}
		q_push_ptr(queue, newobj);

		delist_object(cave, obj);
		object_delete(cave, player->cave, &obj);

		/* Next object */
		obj = next;
	}

	/* Disassociate the objects from the square */
	square_set_obj(cave, grid, NULL);

	/* Set feature to an open door */
	square_force_floor(cave, grid);
	square_add_door(cave, grid, false);

	/* Drop objects back onto the floor */
	while (q_len(queue) > 0) {
		/* Take object from the queue */
		obj = q_pop_ptr(queue);

		/* Unrevealed mimics require special handling, as always. */
		if (obj->mimicking_m_idx) {
			struct monster *mimic =
				cave_monster(cave, obj->mimicking_m_idx);
			int d;

			assert(mimic);
			/*
			 * Reset since the current value is a dangling
			 * reference to a deleted object.
			 */
			mimic->mimicked_obj = NULL;

			/* Try to find a location; use closer grids first. */
			d = 1;
			while (1) {
				struct loc newgrid;
				bool dummy = true;

				if (d >= 4) {
					/*
					 * Give up.  Destroy both the mimic
					 * and the object.
					 */
					delete_monster_idx(cave, obj->mimicking_m_idx);
					if (obj->known) {
						object_delete(player->cave, NULL, &obj->known);
					}
					object_delete(cave, player->cave, &obj);
					break;
				}
				if (scatter_ext(cave, &newgrid, 1, grid, d,
						true, square_isempty) > 0
						&& floor_carry(cave, newgrid,
						obj, &dummy)) {
					/*
					 * Move the monster and give it the
					 * object.
					 */
					monster_swap(grid, newgrid);
					mimic->mimicked_obj = obj;
					break;
				}
				++d;
			}
		} else {
			/* Drop the object */
			drop_near(cave, &obj, 0, grid, false, false);
		}
	}

	/* Reset cave feature, remove trap if needed */
	square_set_feat(cave, grid, feat_old->fidx);
	if (trap && !square_istrappable(cave, grid)) {
		square_destroy_trap(cave, grid);
	}

	q_free(queue);
}